

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

bool despot::util::tinyxml::TiXmlBase::StringEqual
               (char *p,char *tag,bool ignoreCase,TiXmlEncoding encoding)

{
  char cVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (p == (char *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1ef,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  if (tag == (char *)0x0) {
    __assert_fail("tag",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1f0,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  cVar3 = *p;
  if (cVar3 == '\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0x1f2,
                  "static bool despot::util::tinyxml::TiXmlBase::StringEqual(const char *, const char *, bool, TiXmlEncoding)"
                 );
  }
  if (ignoreCase) {
    lVar7 = 0;
    while (cVar3 != '\0') {
      if (tag[lVar7] == '\0') goto LAB_00179da4;
      iVar5 = ToLower((int)cVar3,encoding);
      iVar6 = ToLower((int)tag[lVar7],encoding);
      if (iVar5 != iVar6) break;
      lVar2 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      cVar3 = p[lVar2];
    }
    cVar1 = tag[lVar7];
  }
  else {
    lVar7 = 0;
    while ((cVar1 = tag[lVar7], cVar3 != '\0' && (cVar3 == cVar1))) {
      lVar2 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      cVar3 = p[lVar2];
    }
  }
  if (cVar1 == '\0') {
LAB_00179da4:
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool TiXmlBase::StringEqual(const char* p, const char* tag, bool ignoreCase,
	TiXmlEncoding encoding) {
	assert(p);
	assert(tag);
	if (!p || !*p) {
		assert(0);
		return false;
	}

	const char* q = p;

	if (ignoreCase) {
		while (*q && *tag && ToLower(*q, encoding) == ToLower(*tag, encoding)) {
			++q;
			++tag;
		}

		if (*tag == 0)
			return true;
	} else {
		while (*q && *tag && *q == *tag) {
			++q;
			++tag;
		}

		if (*tag == 0) // Have we found the end of the tag, and everything equal?
			return true;
	}
	return false;
}